

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineArguments_setCompleteGroupDotNameFilter_Test::testBody
          (TEST_CommandLineArguments_setCompleteGroupDotNameFilter_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TestFilter *pTVar4;
  TestFilter *pTVar5;
  char *pcVar6;
  char *pcVar7;
  TestFilter TStack_98;
  undefined1 local_78 [16];
  TestFilter local_68;
  char *argv [3];
  
  argv[2] = "group.name";
  argv[0] = "tests.exe";
  argv[1] = "-t";
  pUVar2 = UtestShell::getCurrent();
  bVar1 = TEST_GROUP_CppUTestGroupCommandLineArguments::newArgumentParser
                    (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments,3,argv);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","newArgumentParser(argc, argv)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
             ,0xd6,pTVar3);
  TestFilter::TestFilter(&TStack_98,"group");
  pTVar4 = CommandLineArguments::getGroupFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=(&TStack_98,pTVar4);
  SimpleString::~SimpleString(&TStack_98.filter_);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    pTVar5 = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,pTVar5);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xd7);
    }
    TestFilter::TestFilter(&TStack_98,"group");
    TestFilter::TestFilter((TestFilter *)(local_78 + 0x10),"group");
    bVar1 = TestFilter::operator!=(&TStack_98,(TestFilter *)(local_78 + 0x10));
    SimpleString::~SimpleString((SimpleString *)(local_78 + 0x10));
    SimpleString::~SimpleString(&TStack_98.filter_);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xd7);
    }
    pUVar2 = UtestShell::getCurrent();
    TestFilter::TestFilter(&TStack_98,"group");
    StringFrom((TestFilter *)(local_78 + 0x10));
    pcVar6 = SimpleString::asCharString((SimpleString *)(local_78 + 0x10));
    CommandLineArguments::getGroupFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)local_78);
    pcVar7 = SimpleString::asCharString((SimpleString *)local_78);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xd7,pTVar3);
    SimpleString::~SimpleString((SimpleString *)local_78);
    SimpleString::~SimpleString((SimpleString *)(local_78 + 0x10));
    SimpleString::~SimpleString(&TStack_98.filter_);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xd7,pTVar3);
  }
  TestFilter::TestFilter(&TStack_98,"name");
  pTVar4 = CommandLineArguments::getNameFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=(&TStack_98,pTVar4);
  SimpleString::~SimpleString(&TStack_98.filter_);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getNameFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    pTVar5 = CommandLineArguments::getNameFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,pTVar5);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xd8);
    }
    TestFilter::TestFilter(&TStack_98,"name");
    TestFilter::TestFilter((TestFilter *)(local_78 + 0x10),"name");
    bVar1 = TestFilter::operator!=(&TStack_98,(TestFilter *)(local_78 + 0x10));
    SimpleString::~SimpleString((SimpleString *)(local_78 + 0x10));
    SimpleString::~SimpleString(&TStack_98.filter_);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xd8);
    }
    pUVar2 = UtestShell::getCurrent();
    TestFilter::TestFilter(&TStack_98,"name");
    StringFrom((TestFilter *)(local_78 + 0x10));
    pcVar6 = SimpleString::asCharString((SimpleString *)(local_78 + 0x10));
    CommandLineArguments::getNameFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)local_78);
    pcVar7 = SimpleString::asCharString((SimpleString *)local_78);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xd8,pTVar3);
    SimpleString::~SimpleString((SimpleString *)local_78);
    SimpleString::~SimpleString((SimpleString *)(local_78 + 0x10));
    SimpleString::~SimpleString(&TStack_98.filter_);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xd8,pTVar3);
  }
  return;
}

Assistant:

TEST(CommandLineArguments, setCompleteGroupDotNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-t", "group.name" };
    CHECK(newArgumentParser(argc, argv));
    CHECK_EQUAL(TestFilter("group"), *args->getGroupFilters());
    CHECK_EQUAL(TestFilter("name"), *args->getNameFilters());
}